

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zPrint_SuperNode_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined8 *puVar16;
  
  printf("\nSuperNode matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  uVar1 = A->ncol;
  uVar11 = (ulong)uVar1;
  piVar4 = (int *)A->Store;
  lVar15 = *(long *)(piVar4 + 2);
  lVar5 = *(long *)(piVar4 + 10);
  lVar6 = *(long *)(piVar4 + 0xc);
  lVar7 = *(long *)(piVar4 + 8);
  lVar8 = *(long *)(piVar4 + 6);
  printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n",(ulong)(uint)A->nrow,uVar11,(long)*piVar4,
         (ulong)(uint)piVar4[1]);
  puts("nzval:");
  if (-1 < piVar4[1]) {
    lVar10 = 0;
    do {
      iVar2 = *(int *)(lVar6 + lVar10 * 4);
      uVar12 = (ulong)iVar2;
      iVar3 = *(int *)(lVar6 + 4 + lVar10 * 4);
      uVar13 = uVar12;
      if (iVar2 < iVar3) {
        do {
          iVar2 = *(int *)(lVar7 + uVar12 * 4);
          lVar14 = (long)iVar2;
          if (iVar2 < *(int *)(lVar7 + 4 + uVar12 * 4)) {
            puVar16 = (undefined8 *)
                      (lVar15 + 8 + (long)*(int *)(*(long *)(piVar4 + 4) + uVar13 * 4) * 8);
            do {
              printf("%d\t%d\t%e\t%e\n",puVar16[-1],*puVar16,(ulong)*(uint *)(lVar8 + lVar14 * 4),
                     uVar13 & 0xffffffff);
              lVar14 = lVar14 + 1;
              puVar16 = puVar16 + 2;
            } while (lVar14 < *(int *)(lVar7 + 4 + uVar12 * 4));
          }
          uVar13 = uVar13 + 1;
        } while (iVar3 != (int)uVar13);
      }
      bVar9 = lVar10 < piVar4[1];
      lVar10 = lVar10 + 1;
    } while (bVar9);
  }
  printf("\nnzval_colptr: ");
  if (-1 < (int)uVar1) {
    lVar15 = 0;
    do {
      printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 4) + lVar15 * 4));
      lVar15 = lVar15 + 1;
    } while (uVar11 + 1 != lVar15);
  }
  printf("\nrowind: ");
  if (0 < *(int *)(*(long *)(piVar4 + 8) + (long)(int)uVar1 * 4)) {
    lVar15 = 0;
    do {
      printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 6) + lVar15 * 4));
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)(*(long *)(piVar4 + 8) + (long)(int)uVar1 * 4));
  }
  printf("\nrowind_colptr: ");
  if (-1 < (int)uVar1) {
    uVar13 = 0;
    do {
      printf("%lld  ",(long)*(int *)(*(long *)(piVar4 + 8) + uVar13 * 4));
      uVar13 = uVar13 + 1;
    } while (uVar1 + 1 != uVar13);
  }
  printf("\ncol_to_sup: ");
  if (0 < (int)uVar1) {
    uVar13 = 0;
    do {
      printf("%d  ",(ulong)*(uint *)(lVar5 + uVar13 * 4));
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  printf("\nsup_to_col: ");
  if (-2 < piVar4[1]) {
    lVar15 = -1;
    do {
      printf("%d  ",(ulong)*(uint *)(lVar6 + 4 + lVar15 * 4));
      lVar15 = lVar15 + 1;
    } while (lVar15 <= piVar4[1]);
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
zPrint_SuperNode_Matrix(char *what, SuperMatrix *A)
{
    SCformat     *Astore;
    register int_t i, j, k, c, d, n, nsup;
    double       *dp;
    int *col_to_sup, *sup_to_col;
    int_t *rowind, *rowind_colptr;
    
    printf("\nSuperNode matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (SCformat *) A->Store;
    dp = (double *) Astore->nzval;
    col_to_sup = Astore->col_to_sup;
    sup_to_col = Astore->sup_to_col;
    rowind_colptr = Astore->rowind_colptr;
    rowind = Astore->rowind;
    printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n", 
	   (int)A->nrow, (int)A->ncol, (long long) Astore->nnz, (int)Astore->nsuper);
    printf("nzval:\n");
    for (k = 0; k <= Astore->nsuper; ++k) {
      c = sup_to_col[k];
      nsup = sup_to_col[k+1] - c;
      for (j = c; j < c + nsup; ++j) {
	d = Astore->nzval_colptr[j];
	for (i = rowind_colptr[c]; i < rowind_colptr[c+1]; ++i) {
	  printf("%d\t%d\t%e\t%e\n", (int)rowind[i], (int) j, dp[d], dp[d+1]);
          d += 2;	
	}
      }
    }
#if 0
    for (i = 0; i < 2*Astore->nzval_colptr[n]; ++i) printf("%f  ", dp[i]);
#endif
    printf("\nnzval_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->nzval_colptr[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->rowind_colptr[n]; ++i) 
        printf("%lld  ", (long long)Astore->rowind[i]);
    printf("\nrowind_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->rowind_colptr[i]);
    printf("\ncol_to_sup: ");
    for (i = 0; i < n; ++i) printf("%d  ", col_to_sup[i]);
    printf("\nsup_to_col: ");
    for (i = 0; i <= Astore->nsuper+1; ++i) 
        printf("%d  ", sup_to_col[i]);
    printf("\n");
    fflush(stdout);
}